

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_join_cluster_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  long *plVar4;
  pointer psVar5;
  buffer *buf;
  undefined8 *puVar6;
  runtime_error *this_00;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ptr<resp_msg> pVar8;
  undefined1 auVar9 [16];
  ptr<cluster_config> local_50;
  _List_node_base *local_40;
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  puVar6 = (undefined8 *)operator_new(0x40);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_00178730;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar6[3] = peVar3;
  *(undefined4 *)(puVar6 + 4) = 0xd;
  *(undefined4 *)((long)puVar6 + 0x24) = uVar2;
  *(undefined4 *)(puVar6 + 5) = uVar1;
  puVar6[2] = &PTR__msg_base_00178780;
  puVar6[6] = 0;
  *(undefined1 *)(puVar6 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar6;
  this->_vptr_raft_server = (_func_int **)(puVar6 + 2);
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (*(int *)(**(long **)(in_RDX + 0x38) + 8) == 2)) {
    if (*(char *)((long)&req->last_log_idx_ + 2) != '\x01') {
      *(undefined1 *)((long)&req->last_log_idx_ + 2) = 1;
      *(undefined4 *)
       &req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 1;
      *(undefined4 *)&(req->super_msg_base).term_ = *(undefined4 *)(in_RDX + 0x14);
      *(undefined8 *)&(req->super_msg_base).dst_ = 0;
      req->last_log_term_ = 0;
      psVar5 = req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      *(undefined4 *)
       &(psVar5->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
        ._M_pi = 0xffffffff;
      (psVar5->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(element_type **)(in_RDX + 8);
      (**(code **)(((((req->log_entries_).
                      super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                   ->term_ + 0x20))();
      buf = *(buffer **)(**(long **)(in_RDX + 0x38) + 0x18);
      if (buf == (buffer *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"get_buf cannot be called for a log_entry with nil buffer");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cluster_config::deserialize((cluster_config *)&local_50,buf);
      reconfigure((raft_server *)req,&local_50);
      if (local_50.super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      auVar9 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var7._M_pi = auVar9._8_8_;
      puVar6[6] = auVar9._0_8_;
      *(undefined1 *)(puVar6 + 7) = 1;
      goto LAB_0014deb8;
    }
    plVar4 = (long *)req[4].last_log_term_;
    local_50.super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"this server is already in log syncing mode","");
    (**(code **)(*plVar4 + 0x18))(plVar4,&local_50);
    _Var7._M_pi = extraout_RDX;
  }
  else {
    plVar4 = (long *)req[4].last_log_term_;
    local_50.super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "receive an invalid JoinClusterRequest as the log entry value doesn\'t meet the requirements"
               ,"");
    (**(code **)(*plVar4 + 0x18))(plVar4,&local_50);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (local_50.super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&local_40) {
    operator_delete(local_50.
                    super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(ulong)((long)&local_40->_M_next + 1));
    _Var7._M_pi = extraout_RDX_01;
  }
LAB_0014deb8:
  pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_join_cluster_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::join_cluster_response, id_, req.get_src()));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::conf)
    {
        l_->info("receive an invalid JoinClusterRequest as the log entry value doesn't meet the requirements");
        return resp;
    }

    if (catching_up_)
    {
        l_->info("this server is already in log syncing mode");
        return resp;
    }

    catching_up_ = true;
    role_ = srv_role::follower;
    leader_ = req.get_src();
    sm_commit_index_ = 0;
    quick_commit_idx_ = 0;
    state_->set_voted_for(-1);
    state_->set_term(req.get_term());
    ctx_->state_mgr_->save_state(*state_);
    reconfigure(cluster_config::deserialize(entries[0]->get_buf()));
    resp->accept(log_store_->next_slot());
    return resp;
}